

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

char * Diligent::GetShaderCodeVariableClassString(SHADER_CODE_VARIABLE_CLASS Class)

{
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  char *pcStack_10;
  SHADER_CODE_VARIABLE_CLASS Class_local;
  
  switch(Class) {
  case SHADER_CODE_VARIABLE_CLASS_UNKNOWN:
    pcStack_10 = "unknown";
    break;
  case SHADER_CODE_VARIABLE_CLASS_SCALAR:
    pcStack_10 = "scalar";
    break;
  case SHADER_CODE_VARIABLE_CLASS_VECTOR:
    pcStack_10 = "vector";
    break;
  case SHADER_CODE_VARIABLE_CLASS_MATRIX_ROWS:
    pcStack_10 = "matrix-rows";
    break;
  case SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS:
    pcStack_10 = "matrix-columns";
    break;
  case SHADER_CODE_VARIABLE_CLASS_STRUCT:
    pcStack_10 = "struct";
    break;
  default:
    msg.field_2._M_local_buf[0xf] = Class;
    FormatString<char[35]>((string *)local_38,(char (*) [35])"Unknown/unsupported variable class");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetShaderCodeVariableClassString",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x693);
    std::__cxx11::string::~string((string *)local_38);
    pcStack_10 = "UNKNOWN";
  }
  return pcStack_10;
}

Assistant:

const char* GetShaderCodeVariableClassString(SHADER_CODE_VARIABLE_CLASS Class)
{
    static_assert(SHADER_CODE_VARIABLE_CLASS_COUNT == 6, "Did you add a new variable class? Please update the switch below.");
    switch (Class)
    {
        // clang-format off
        case SHADER_CODE_VARIABLE_CLASS_UNKNOWN:        return "unknown";
        case SHADER_CODE_VARIABLE_CLASS_SCALAR:         return "scalar";
        case SHADER_CODE_VARIABLE_CLASS_VECTOR:         return "vector";
        case SHADER_CODE_VARIABLE_CLASS_MATRIX_ROWS:    return "matrix-rows";
        case SHADER_CODE_VARIABLE_CLASS_MATRIX_COLUMNS: return "matrix-columns";
        case SHADER_CODE_VARIABLE_CLASS_STRUCT:         return "struct";
        // clang-format on
        default: UNEXPECTED("Unknown/unsupported variable class"); return "UNKNOWN";
    }
}